

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_dir.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined8 uVar2;
  long in_RSI;
  int in_EDI;
  ALLEGRO_FS_ENTRY *entry_1;
  ALLEGRO_FS_ENTRY *entry;
  int i;
  ALLEGRO_FS_ENTRY *in_stack_ffffffffffffffd0;
  int local_14;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log_monospace();
  log_printf("Example of filesystem entry functions:\n\n%-36s %-6s %8s %8s %8s %8s\n","name","flags"
             ,"ctime","mtime","atime","size");
  log_printf("------------------------------------ ------ -------- -------- -------- --------\n");
  if (in_EDI == 1) {
    uVar2 = al_create_fs_entry("data");
    print_entry(in_stack_ffffffffffffffd0);
    print_fs_entry(in_stack_ffffffffffffffd0);
    print_fs_entry_norecurse(in_stack_ffffffffffffffd0);
    al_destroy_fs_entry(uVar2);
  }
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    uVar2 = al_create_fs_entry(*(undefined8 *)(in_RSI + (long)local_14 * 8));
    print_entry(in_stack_ffffffffffffffd0);
    print_fs_entry(in_stack_ffffffffffffffd0);
    print_fs_entry_norecurse(in_stack_ffffffffffffffd0);
    al_destroy_fs_entry(uVar2);
  }
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   open_log_monospace();
   
   log_printf("Example of filesystem entry functions:\n\n%-36s %-6s %8s %8s %8s %8s\n",
      "name", "flags", "ctime", "mtime", "atime", "size");
   log_printf(
      "------------------------------------ "
      "------ "
      "-------- "
      "-------- "
      "-------- "
      "--------\n");

   #ifdef ALLEGRO_ANDROID
   al_android_set_apk_fs_interface();
   #endif

   if (argc == 1) {
      ALLEGRO_FS_ENTRY *entry = al_create_fs_entry("data");
      print_entry(entry);
      print_fs_entry(entry);
      print_fs_entry_norecurse(entry);
      al_destroy_fs_entry(entry);
   }

   for (i = 1; i < argc; i++) {
      ALLEGRO_FS_ENTRY *entry = al_create_fs_entry(argv[i]);
      print_entry(entry);
      print_fs_entry(entry);
      print_fs_entry_norecurse(entry);
      al_destroy_fs_entry(entry);
   }

   close_log(true);
   return 0;
}